

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::~DFA(DFA *this)

{
  void *pvVar1;
  long in_RDI;
  Mutex *this_00;
  
  pvVar1 = *(void **)(in_RDI + 0x48);
  if (pvVar1 != (void *)0x0) {
    Workq::~Workq((Workq *)0x24655c);
    operator_delete(pvVar1);
  }
  this_00 = *(Mutex **)(in_RDI + 0x50);
  if (this_00 != (Mutex *)0x0) {
    Workq::~Workq((Workq *)0x246584);
    operator_delete(this_00);
  }
  ClearCache(this);
  std::
  unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
  ::~unordered_set((unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
                    *)0x2465ab);
  Mutex::~Mutex(this_00);
  PODArray<int>::~PODArray((PODArray<int> *)0x2465c7);
  Mutex::~Mutex(this_00);
  return;
}

Assistant:

DFA::~DFA() {
  delete q0_;
  delete q1_;
  ClearCache();
}